

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  _Base_ptr p_Var1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  runtime_error *prVar8;
  _List_node_base *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start_00;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  string tHypotheticalArgument;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *__const_this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Base_ptr local_a8;
  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
  *local_a0;
  string local_98;
  string local_78;
  _List_node_base *local_58;
  string local_50;
  
  __str = (aArguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (((this->mProgramName)._M_string_length == 0) &&
     (__str != (aArguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->mProgramName,__str);
    __str = (aArguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  end._M_current =
       (aArguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  start_00._M_current = __str + 1;
  if (start_00._M_current != end._M_current) {
    local_58 = (_List_node_base *)&this->mPositionalArguments;
    p_Var9 = (this->mPositionalArguments).
             super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    local_a0 = (_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                *)&this->mArgumentMap;
    local_a8 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      paVar11 = &local_50.field_2;
      paVar7 = &local_78.field_2;
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(start_00._M_current,"-h");
      if ((iVar5 == 0) ||
         (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(start_00._M_current,"--help"), iVar5 == 0)) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"help called");
LAB_0010fa2a:
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar4 = Argument::is_optional(start_00._M_current);
      if (bVar4) {
        cVar6 = std::
                _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                ::_M_find_tr<std::__cxx11::string,void>(local_a0,start_00._M_current);
        if (cVar6._M_node == local_a8) {
          if ((((start_00._M_current)->_M_string_length < 2) ||
              (pcVar3 = ((start_00._M_current)->_M_dataplus)._M_p, *pcVar3 != '-')) ||
             (pcVar3[1] == '-')) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,"Unknown argument");
            goto LAB_0010fa2a;
          }
          start._M_current = start_00._M_current + 1;
          uVar13 = 1;
          do {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8.field_2._M_allocated_capacity._0_2_ =
                 (ushort)(byte)((start_00._M_current)->_M_dataplus)._M_p[uVar13] << 8 | 0x2d;
            local_c8._M_string_length = 2;
            local_c8.field_2._M_local_buf[2] = '\0';
            cVar6 = std::
                    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                    ::_M_find_tr<std::__cxx11::string,void>(local_a0,&local_c8);
            if (cVar6._M_node == local_a8) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"Unknown argument");
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            p_Var1 = cVar6._M_node[1]._M_left;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_c8._M_dataplus._M_p,
                       local_c8._M_dataplus._M_p + local_c8._M_string_length);
            start = Argument::
                    consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((Argument *)&p_Var1->_M_left,start,end,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT53(local_c8.field_2._M_allocated_capacity._3_5_,
                                       CONCAT12(local_c8.field_2._M_local_buf[2],
                                                local_c8.field_2._M_allocated_capacity._0_2_)) + 1);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (start_00._M_current)->_M_string_length);
        }
        else {
          p_Var1 = cVar6._M_node[1]._M_left;
          pcVar2 = ((start_00._M_current)->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + (start_00._M_current)->_M_string_length);
          start = Argument::
                  consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((Argument *)&p_Var1->_M_left,start_00._M_current + 1,end,&local_50);
          paVar7 = paVar11;
          _Var10._M_p = local_50._M_dataplus._M_p;
          p_Var12 = p_Var9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar11) {
LAB_0010f868:
            operator_delete(_Var10._M_p,paVar7->_M_allocated_capacity + 1);
            p_Var9 = p_Var12;
          }
        }
      }
      else {
        if (p_Var9 == local_58) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"Maximum number of positional arguments exceeded");
          goto LAB_0010fa2a;
        }
        p_Var12 = p_Var9->_M_next;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)paVar7;
        start = Argument::
                consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((Argument *)(p_Var9 + 1),start_00,end,&local_78);
        _Var10._M_p = local_78._M_dataplus._M_p;
        p_Var9 = p_Var12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar7) goto LAB_0010f868;
      }
      start_00._M_current = start._M_current;
    } while (start_00._M_current != end._M_current);
  }
  return;
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
    if (mProgramName.empty() && !aArguments.empty()) {
      mProgramName = aArguments.front();
    }
    auto end = std::end(aArguments);
    auto positionalArgumentIt = std::begin(mPositionalArguments);
    for (auto it = std::next(std::begin(aArguments)); it != end;) {
      const auto &tCurrentArgument = *it;
      if (tCurrentArgument == Argument::mHelpOption ||
          tCurrentArgument == Argument::mHelpOptionLong) {
        throw std::runtime_error("help called");
      }
      if (Argument::is_positional(tCurrentArgument)) {
        if (positionalArgumentIt == std::end(mPositionalArguments)) {
          throw std::runtime_error(
              "Maximum number of positional arguments exceeded");
        }
        auto tArgument = positionalArgumentIt++;
        it = tArgument->consume(it, end);
      } else if (auto tIterator = mArgumentMap.find(tCurrentArgument);
                 tIterator != mArgumentMap.end()) {
        auto tArgument = tIterator->second;
        it = tArgument->consume(std::next(it), end, tCurrentArgument);
      } else if (const auto &tCompoundArgument = tCurrentArgument;
                 tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                 tCompoundArgument[1] != '-') {
        ++it;
        for (size_t j = 1; j < tCompoundArgument.size(); j++) {
          auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
          auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
          if (tIterator2 != mArgumentMap.end()) {
            auto tArgument = tIterator2->second;
            it = tArgument->consume(it, end, tHypotheticalArgument);
          } else {
            throw std::runtime_error("Unknown argument");
          }
        }
      } else {
        throw std::runtime_error("Unknown argument");
      }
    }
  }